

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfcn.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  vector<Object,_std::allocator<Object>_> *objects_00;
  Allocator **ppAVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  char *pcVar6;
  pointer pOVar7;
  int iVar8;
  bool bVar9;
  Size SVar10;
  char cVar11;
  int iVar12;
  ulong uVar13;
  float *pfVar14;
  size_t sVar15;
  uint uVar16;
  pointer pOVar17;
  ulong uVar18;
  int *piVar19;
  long lVar20;
  long lVar21;
  size_type __new_size;
  int iVar22;
  uint uVar23;
  long lVar24;
  float fVar25;
  float fVar26;
  float extraout_XMM0_Db;
  __m128 t_2;
  float extraout_XMM0_Db_00;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar32;
  float fVar33;
  __m128 t;
  float fVar34;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  float fVar43;
  float fVar44;
  undefined1 auVar42 [16];
  float fVar45;
  vector<Object,_std::allocator<Object>_> objects;
  vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  class_candidates;
  Extractor ex1;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  Mat m_1;
  Size label_size;
  Mat local_3e8;
  undefined1 local_398 [16];
  float local_388 [4];
  Allocator *local_378;
  int iStack_370;
  int iStack_36c;
  int iStack_368;
  undefined8 uStack_364;
  size_t local_358;
  Mat local_348;
  Mat local_2f8;
  value_type local_2b0;
  Mat image;
  undefined4 local_290;
  int iStack_28c;
  Allocator *local_278;
  Mat local_208;
  Extractor ex2;
  Mat m;
  int local_1a0;
  int iStack_19c;
  uchar *local_198;
  float mean_vals [3];
  Net rfcn;
  
  if (argc == 2) {
    pcVar6 = argv[1];
    std::__cxx11::string::string((string *)&rfcn,pcVar6,(allocator *)&image);
    cv::imread((string *)&m,(int)&rfcn);
    if ((Allocator **)rfcn._vptr_Net != &rfcn.opt.blob_allocator) {
      operator_delete(rfcn._vptr_Net);
    }
    cVar11 = cv::Mat::empty();
    if (cVar11 == '\0') {
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&rfcn);
      rfcn.opt.use_vulkan_compute = true;
      ncnn::Net::load_param(&rfcn,"rfcn_end2end.param");
      ncnn::Net::load_model(&rfcn,"rfcn_end2end.bin");
      if (iStack_19c < local_1a0) {
        local_498._4_4_ = 224.0 / (float)iStack_19c;
        iVar22 = (int)((float)local_1a0 * (float)local_498._4_4_);
        iVar12 = 0xe0;
      }
      else {
        local_498._4_4_ = 224.0 / (float)local_1a0;
        iVar12 = (int)((float)iStack_19c * (float)local_498._4_4_);
        iVar22 = 0xe0;
      }
      ncnn::Mat::from_pixels_resize
                ((Mat *)&image,local_198,2,iStack_19c,local_1a0,iVar12,iVar22,(Allocator *)0x0);
      mean_vals[0] = 102.9801;
      mean_vals[1] = 115.9465;
      mean_vals[2] = 122.7717;
      ncnn::Mat::substract_mean_normalize((Mat *)&image,mean_vals,(float *)0x0);
      local_358 = 0;
      local_398._0_8_ = (float *)0x0;
      local_398._8_4_ = 0;
      local_398._12_4_ = 0;
      local_388[0] = 0.0;
      local_388[1] = 0.0;
      local_388[2] = 0.0;
      local_378 = (Allocator *)0x0;
      iStack_370 = 0;
      iStack_36c = 0;
      iStack_368 = 0;
      uStack_364._0_4_ = 0;
      uStack_364._4_4_ = 0;
      ncnn::Mat::create((Mat *)local_398,3,4,(Allocator *)0x0);
      *(float *)local_398._0_8_ = (float)iVar22;
      *(float *)(local_398._0_8_ + 4) = (float)iVar12;
      *(undefined4 *)(local_398._0_8_ + 8) = local_498._4_4_;
      ncnn::Net::create_extractor((Net *)&ex1);
      ncnn::Extractor::input(&ex1,"data",(Mat *)&image);
      ncnn::Extractor::input(&ex1,"im_info",(Mat *)local_398);
      local_208.cstep = 0;
      local_208.data = (void *)0x0;
      local_208.refcount._0_4_ = 0;
      local_208.refcount._4_4_ = 0;
      local_208.elemsize._0_4_ = 0;
      local_208.elemsize._4_4_ = 0;
      local_208.elempack = 0;
      local_208.allocator = (Allocator *)0x0;
      local_208.dims = 0;
      local_208.w = 0;
      local_208.h = 0;
      local_208.d = 0;
      local_208.c = 0;
      local_2f8.cstep = 0;
      local_2f8.data = (void *)0x0;
      local_2f8.refcount._0_4_ = 0;
      local_2f8.refcount._4_4_ = 0;
      local_2f8.elemsize._0_4_ = 0;
      local_2f8.elemsize._4_4_ = 0;
      local_2f8.elempack = 0;
      local_2f8.allocator = (Allocator *)0x0;
      local_2f8.dims = 0;
      local_2f8.w = 0;
      local_2f8.h = 0;
      local_2f8.d = 0;
      local_2f8.c = 0;
      local_3e8.cstep = 0;
      local_3e8.data = (void *)0x0;
      local_3e8.refcount._0_4_ = 0;
      local_3e8.refcount._4_4_ = 0;
      local_3e8.elemsize._0_4_ = 0;
      local_3e8.elemsize._4_4_ = 0;
      local_3e8.elempack = 0;
      local_3e8.allocator = (Allocator *)0x0;
      local_3e8.dims = 0;
      local_3e8.w = 0;
      local_3e8.h = 0;
      local_3e8.d = 0;
      local_3e8.c = 0;
      ncnn::Extractor::extract(&ex1,"rfcn_cls",&local_208,0);
      ncnn::Extractor::extract(&ex1,"rfcn_bbox",&local_2f8,0);
      ncnn::Extractor::extract(&ex1,"rois",&local_3e8,0);
      class_candidates.
      super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      class_candidates.
      super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      class_candidates.
      super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (0 < local_3e8.c) {
        local_498._0_4_ = local_498._4_4_;
        fStack_490 = (float)local_498._4_4_;
        fStack_48c = (float)local_498._4_4_;
        lVar24 = 0;
        do {
          ncnn::Net::create_extractor((Net *)&ex2);
          m_1.c = 1;
          if (local_3e8.dims != 3) {
            m_1.c = local_3e8.d;
          }
          m_1.elemsize = CONCAT44(local_3e8.elemsize._4_4_,(undefined4)local_3e8.elemsize);
          m_1.data = (void *)(local_3e8.cstep * lVar24 * m_1.elemsize + (long)local_3e8.data);
          m_1.dims = local_3e8.dims == 3 ^ 3;
          m_1.refcount = (int *)0x0;
          m_1.elempack = local_3e8.elempack;
          m_1.allocator = local_3e8.allocator;
          m_1.w = local_3e8.w;
          m_1.h = local_3e8.h;
          m_1.cstep = (long)local_3e8.h * (long)local_3e8.w;
          m_1.d = 1;
          ncnn::Extractor::input(&ex2,"rfcn_cls",&local_208);
          ncnn::Extractor::input(&ex2,"rfcn_bbox",&local_2f8);
          ncnn::Extractor::input(&ex2,"rois",&m_1);
          label_size.width = 0;
          label_size.height = 0;
          local_348.cstep = 0;
          local_348.data = (void *)0x0;
          local_348.refcount._0_4_ = 0;
          local_348.refcount._4_4_ = 0;
          local_348.elemsize._0_4_ = 0;
          local_348._20_8_ = 0;
          local_348.h = 0;
          local_348.d = 0;
          local_348.c = 0;
          local_348.allocator = (Allocator *)0x0;
          local_348.dims = 0;
          local_348.w = 0;
          ncnn::Extractor::extract(&ex2,"bbox_pred",(Mat *)&label_size,0);
          ncnn::Extractor::extract(&ex2,"cls_prob",&local_348,0);
          iVar12 = local_348.w;
          __new_size = (size_type)local_348.w;
          std::
          vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
          ::resize(&class_candidates,__new_size);
          SVar10 = label_size;
          if (0 < iVar12) {
            fVar37 = 0.0;
            uVar13 = 0;
            uVar18 = 0;
            do {
              fVar26 = *(float *)((long)local_348.data + uVar13 * 4);
              if (fVar37 < fVar26) {
                uVar18 = uVar13 & 0xffffffff;
                fVar37 = fVar26;
              }
              uVar13 = uVar13 + 1;
            } while (__new_size != uVar13);
            iVar12 = (int)uVar18;
            if ((iVar12 != 0) && (0.6 < fVar37)) {
              uVar18 = *m_1.data;
              uVar13 = *(ulong *)((long)m_1.data + 8);
              fVar26 = *(float *)((long)label_size + 0x1c);
              fVar25 = expf(*(float *)((long)label_size + 0x18));
              fVar26 = expf(fVar26);
              auVar35._8_8_ = 0;
              auVar35._0_8_ = uVar18;
              auVar35 = divps(auVar35,_local_498);
              auVar42._8_8_ = 0;
              auVar42._0_8_ = uVar13;
              auVar42 = divps(auVar42,_local_498);
              fVar41 = (auVar42._0_4_ - auVar35._0_4_) + (float)DAT_00313020;
              fVar43 = (auVar42._4_4_ - auVar35._4_4_) + DAT_00313020._4_4_;
              fVar44 = (auVar42._8_4_ - auVar35._8_4_) + DAT_00313020._8_4_;
              fVar45 = (auVar42._12_4_ - auVar35._12_4_) + DAT_00313020._12_4_;
              fVar29 = (float)*(undefined8 *)((long)SVar10 + 0x10) * fVar41 +
                       fVar41 * 0.5 + auVar35._0_4_;
              fVar32 = (float)((ulong)*(undefined8 *)((long)SVar10 + 0x10) >> 0x20) * fVar43 +
                       fVar43 * 0.5 + auVar35._4_4_;
              fVar33 = fVar44 * 0.0 + fVar44 * 0.0 + auVar35._8_4_;
              fVar34 = fVar45 * 0.0 + fVar45 * 0.0 + auVar35._12_4_;
              fVar25 = fVar25 * fVar41 * 0.5;
              fVar26 = fVar26 * fVar43 * 0.5;
              fVar41 = extraout_XMM0_Db * fVar44 * 0.0;
              fVar43 = extraout_XMM0_Db_00 * fVar45 * 0.0;
              auVar27._0_4_ = fVar29 - fVar25;
              auVar27._4_4_ = fVar32 - fVar26;
              auVar27._8_4_ = fVar33 - fVar41;
              auVar27._12_4_ = fVar34 - fVar43;
              auVar39._4_4_ = fVar26 + fVar32;
              auVar39._0_4_ = fVar25 + fVar29;
              auVar39._8_4_ = fVar41 + fVar33;
              auVar39._12_4_ = fVar43 + fVar34;
              auVar30._0_8_ = CONCAT44((float)(local_1a0 + -1),(float)(iStack_19c + -1));
              auVar30._8_4_ = 0xbf800000;
              auVar30._12_4_ = 0xbf800000;
              auVar36._8_4_ = 0xbf800000;
              auVar36._0_8_ = auVar30._0_8_;
              auVar36._12_4_ = 0xbf800000;
              auVar35 = minps(auVar36,auVar27);
              auVar35 = maxps(ZEXT816(0),auVar35);
              auVar42 = minps(auVar30,auVar39);
              auVar42 = maxps(ZEXT816(0),auVar42);
              local_2b0.rect.width = (auVar42._0_4_ - auVar35._0_4_) + (float)DAT_00313020;
              local_2b0.rect.height = (auVar42._4_4_ - auVar35._4_4_) + DAT_00313020._4_4_;
              local_2b0.rect._0_8_ = auVar35._0_8_;
              local_2b0.label = iVar12;
              local_2b0.prob = fVar37;
              std::vector<Object,_std::allocator<Object>_>::push_back
                        (class_candidates.
                         super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + iVar12,&local_2b0);
            }
          }
          piVar19 = (int *)CONCAT44(local_348.refcount._4_4_,local_348.refcount._0_4_);
          if (piVar19 != (int *)0x0) {
            LOCK();
            *piVar19 = *piVar19 + -1;
            UNLOCK();
            if (*piVar19 == 0) {
              if (local_348.allocator == (Allocator *)0x0) {
                if (local_348.data != (void *)0x0) {
                  free(local_348.data);
                }
              }
              else {
                (*(local_348.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (m_1.refcount != (int *)0x0) {
            LOCK();
            *m_1.refcount = *m_1.refcount + -1;
            UNLOCK();
            if (*m_1.refcount == 0) {
              if (m_1.allocator == (Allocator *)0x0) {
                if (m_1.data != (void *)0x0) {
                  free(m_1.data);
                }
              }
              else {
                (*(m_1.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          ncnn::Extractor::~Extractor(&ex2);
          lVar24 = lVar24 + 1;
        } while (lVar24 < local_3e8.c);
      }
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start) {
        objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
        _M_finish = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      pOVar17 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)class_candidates.
                                  super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)class_candidates.
                                 super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
        lVar24 = 0;
        do {
          objects_00 = class_candidates.
                       super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar24;
          pOVar17 = (objects_00->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pOVar7 = (objects_00->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          if (pOVar17 != pOVar7) {
            qsort_descent_inplace
                      (objects_00,0,
                       (int)((ulong)((long)pOVar7 - (long)pOVar17) >> 3) * -0x55555555 + -1);
          }
          label_size.width = 0;
          label_size.height = 0;
          piVar19 = (int *)0x0;
          uVar23 = (int)((long)(objects_00->super__Vector_base<Object,_std::allocator<Object>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(objects_00->super__Vector_base<Object,_std::allocator<Object>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&m_1,(long)(int)uVar23,
                     (allocator_type *)&local_348);
          if (0 < (int)uVar23) {
            pfVar14 = &(((objects_00->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                         super__Vector_impl_data._M_start)->rect).height;
            uVar18 = 0;
            do {
              *(float *)((long)m_1.data + uVar18 * 4) = pfVar14[-1] * *pfVar14;
              uVar18 = uVar18 + 1;
              pfVar14 = pfVar14 + 6;
            } while ((uVar23 & 0x7fffffff) != uVar18);
            local_348.data = (void *)((ulong)local_348.data & 0xffffffff00000000);
            iVar12 = 0;
            piVar19 = (int *)0x0;
            do {
              uVar16 = (uint)((ulong)((long)piVar19 - (long)label_size) >> 2);
              if ((int)uVar16 < 1) {
LAB_0013c700:
                if (piVar19 == (int *)0x0) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&label_size,(iterator)0x0,
                             (int *)&local_348);
                }
                else {
                  *piVar19 = iVar12;
                  piVar19 = piVar19 + 1;
                }
              }
              else {
                pOVar17 = (objects_00->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                lVar20 = (long)iVar12;
                uVar18._0_4_ = pOVar17[lVar20].rect.x;
                uVar18._4_4_ = pOVar17[lVar20].rect.y;
                auVar28._8_8_ = 0;
                auVar28._0_8_ = uVar18;
                uVar2 = pOVar17[lVar20].rect.width;
                uVar4 = pOVar17[lVar20].rect.height;
                auVar31._0_4_ = (float)uVar2 + (float)(undefined4)uVar18;
                auVar31._4_4_ = (float)uVar4 + (float)uVar18._4_4_;
                auVar31._8_8_ = 0;
                bVar9 = true;
                uVar18 = 0;
                do {
                  lVar21 = (long)*(int *)((long)label_size + uVar18 * 4);
                  uVar13._0_4_ = pOVar17[lVar21].rect.x;
                  uVar13._4_4_ = pOVar17[lVar21].rect.y;
                  auVar40._8_8_ = 0;
                  auVar40._0_8_ = uVar13;
                  uVar3 = pOVar17[lVar21].rect.width;
                  uVar5 = pOVar17[lVar21].rect.height;
                  auVar38._0_4_ = (float)uVar3 + (float)(undefined4)uVar13;
                  auVar38._4_4_ = (float)uVar5 + (float)uVar13._4_4_;
                  auVar38._8_8_ = 0;
                  auVar42 = maxps(auVar40,auVar28);
                  auVar35 = minps(auVar38,auVar31);
                  fVar37 = auVar35._0_4_ - auVar42._0_4_;
                  fVar25 = auVar35._4_4_ - auVar42._4_4_;
                  fVar26 = 0.0;
                  if (0.0 < fVar25 && 0.0 < fVar37) {
                    fVar26 = fVar37 * fVar25;
                  }
                  if (0.3 < fVar26 / ((*(float *)((long)m_1.data + lVar21 * 4) +
                                      *(float *)((long)m_1.data + lVar20 * 4)) - fVar26)) {
                    bVar9 = false;
                  }
                  uVar18 = uVar18 + 1;
                } while ((uVar16 & 0x7fffffff) != uVar18);
                if (bVar9) goto LAB_0013c700;
              }
              iVar12 = (int)local_348.data + 1;
              local_348.data = (void *)CONCAT44(local_348.data._4_4_,iVar12);
            } while (iVar12 < (int)uVar23);
          }
          if (m_1.data != (void *)0x0) {
            operator_delete(m_1.data);
          }
          if (0 < (int)((ulong)((long)piVar19 - (long)label_size) >> 2)) {
            lVar20 = 0;
            do {
              std::vector<Object,_std::allocator<Object>_>::push_back
                        (&objects,(objects_00->super__Vector_base<Object,_std::allocator<Object>_>).
                                  _M_impl.super__Vector_impl_data._M_start +
                                  *(int *)((long)label_size + lVar20 * 4));
              lVar20 = lVar20 + 1;
            } while (lVar20 < (int)((ulong)((long)piVar19 - (long)label_size) >> 2));
          }
          if (label_size != (Size)0x0) {
            operator_delete((void *)label_size);
          }
          lVar24 = lVar24 + 1;
        } while (lVar24 < (int)((ulong)((long)class_candidates.
                                              super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)class_candidates.
                                             super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          -0x55555555);
        pOVar17 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
            super__Vector_impl_data._M_start !=
            objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          qsort_descent_inplace
                    (&objects,0,
                     (int)((ulong)((long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)objects.super__Vector_base<Object,_std::allocator<Object>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 3) *
                     -0x55555555 + -1);
          pOVar17 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
      }
      if (100 < (ulong)(((long)pOVar17 -
                         (long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                               super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
        std::vector<Object,_std::allocator<Object>_>::resize(&objects,100);
      }
      std::
      vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
      ::~vector(&class_candidates);
      piVar19 = (int *)CONCAT44(local_3e8.refcount._4_4_,(int)local_3e8.refcount);
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if (local_3e8.allocator == (Allocator *)0x0) {
            if (local_3e8.data != (void *)0x0) {
              free(local_3e8.data);
            }
          }
          else {
            (*(local_3e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar19 = (int *)CONCAT44(local_2f8.refcount._4_4_,local_2f8.refcount._0_4_);
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if (local_2f8.allocator == (Allocator *)0x0) {
            if (local_2f8.data != (void *)0x0) {
              free(local_2f8.data);
            }
          }
          else {
            (*(local_2f8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar19 = (int *)CONCAT44(local_208.refcount._4_4_,local_208.refcount._0_4_);
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if (local_208.allocator == (Allocator *)0x0) {
            if (local_208.data != (void *)0x0) {
              free(local_208.data);
            }
          }
          else {
            (*(local_208.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Extractor::~Extractor(&ex1);
      piVar19 = (int *)CONCAT44(local_398._12_4_,local_398._8_4_);
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if (local_378 == (Allocator *)0x0) {
            if ((float *)local_398._0_8_ != (float *)0x0) {
              free((void *)local_398._0_8_);
            }
          }
          else {
            (*local_378->_vptr_Allocator[3])();
          }
        }
      }
      piVar19 = (int *)CONCAT44(iStack_28c,local_290);
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if (local_278 == (Allocator *)0x0) {
            if (_image != (void *)0x0) {
              free(_image);
            }
          }
          else {
            (*local_278->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&rfcn);
      cv::Mat::clone();
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar24 = 0;
        uVar18 = 0;
        do {
          pOVar17 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start;
          fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",
                  (double)*(float *)((long)&(objects.
                                             super__Vector_base<Object,_std::allocator<Object>_>.
                                             _M_impl.super__Vector_impl_data._M_start)->prob +
                                    lVar24),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).x +
                                    lVar24),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).y +
                                    lVar24),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).width
                                    + lVar24),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).
                                            height + lVar24),
                  (ulong)*(uint *)((long)&(objects.
                                           super__Vector_base<Object,_std::allocator<Object>_>.
                                           _M_impl.super__Vector_impl_data._M_start)->label + lVar24
                                  ));
          local_388[0] = 0.0;
          local_388[1] = 0.0;
          local_398._0_4_ = 0x3010000;
          pfVar14 = (float *)((long)&(pOVar17->rect).x + lVar24);
          local_3e8.refcount._0_4_ = (int)ROUND(pfVar14[2]);
          local_3e8.refcount._4_4_ = (int)ROUND(pfVar14[3]);
          local_3e8.data = (void *)CONCAT44((int)ROUND(pfVar14[1]),(int)ROUND(*pfVar14));
          rfcn._vptr_Net = (_func_int **)0x406fe00000000000;
          rfcn.opt.workspace_allocator = (Allocator *)0x0;
          rfcn.opt.lightmode = false;
          rfcn.opt._1_3_ = 0;
          rfcn.opt.num_threads = 0;
          rfcn.opt.blob_allocator = (Allocator *)0x0;
          local_398._8_8_ = &image;
          cv::rectangle((string *)local_398,&local_3e8,&rfcn,1,8,0);
          sprintf((char *)&rfcn,"%s %.1f%%",
                  (double)(*(float *)((long)&pOVar17->prob + lVar24) * 100.0),
                  _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel +
                  *(int *)(
                          _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel
                          + (long)*(int *)((long)&pOVar17->label + lVar24) * 4));
          class_candidates.
          super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((ulong)class_candidates.
                                super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
          local_398._0_8_ = local_388;
          sVar15 = strlen((char *)&rfcn);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_398,&rfcn,(long)&rfcn._vptr_Net + sVar15);
          cv::getTextSize((string *)&label_size,(int)(string *)local_398,0.5,0,(int *)0x1);
          if ((float *)local_398._0_8_ != local_388) {
            operator_delete((void *)local_398._0_8_);
          }
          iVar12 = (int)*(float *)((long)&(pOVar17->rect).x + lVar24);
          iVar22 = (int)((*(float *)((long)&(pOVar17->rect).y + lVar24) - (float)label_size.height)
                        - (float)(int)class_candidates.
                                      super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
          if (iVar22 < 1) {
            iVar22 = 0;
          }
          iVar8 = iStack_28c - label_size.width;
          if (label_size.width + iVar12 <= iStack_28c) {
            iVar8 = iVar12;
          }
          local_2f8.elemsize._0_4_ = 0;
          local_2f8.elemsize._4_4_ = 0;
          local_2f8.data._0_4_ = 0x3010000;
          m_1.data = (void *)CONCAT44(iVar22,iVar8);
          m_1.refcount = (int *)CONCAT44((int)class_candidates.
                                              super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start +
                                         label_size.height,label_size.width);
          local_398._0_8_ = (void *)0x406fe00000000000;
          local_398._8_4_ = 0;
          local_398._12_4_ = 0x406fe000;
          local_388[0] = 0.0;
          local_388[1] = 3.7480469;
          local_388[2] = 0.0;
          local_388[3] = 0.0;
          local_2f8.refcount = (int *)&image;
          cv::rectangle(&local_2f8,&m_1,(string *)local_398,0xffffffff,8,0);
          local_2f8.elemsize._0_4_ = 0;
          local_2f8.elemsize._4_4_ = 0;
          local_2f8.data = (void *)CONCAT44(local_2f8.data._4_4_,0x3010000);
          local_398._0_8_ = local_388;
          local_2f8.refcount = (int *)&image;
          sVar15 = strlen((char *)&rfcn);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_398,&rfcn,(long)&rfcn._vptr_Net + sVar15);
          local_348.data = (void *)CONCAT44(iVar22 + label_size.height,iVar8);
          local_208.data = (void *)0x0;
          local_208.refcount._0_4_ = 0;
          local_208.refcount._4_4_ = 0;
          local_208.elemsize._0_4_ = 0;
          local_208.elemsize._4_4_ = 0;
          local_208.elempack = 0;
          local_208._28_4_ = 0;
          cv::putText(0x3fe0000000000000,&local_2f8,(string *)local_398,&local_348,0,&local_208,1,8,
                      0);
          if ((float *)local_398._0_8_ != local_388) {
            operator_delete((void *)local_398._0_8_);
          }
          uVar18 = uVar18 + 1;
          lVar24 = lVar24 + 0x18;
        } while (uVar18 < (ulong)(((long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      local_398._8_8_ = &image;
      ppAVar1 = &rfcn.opt.blob_allocator;
      rfcn.opt.blob_allocator = (Allocator *)CONCAT26(rfcn.opt.blob_allocator._6_2_,0x6567616d69);
      rfcn.opt.lightmode = true;
      rfcn.opt._1_3_ = 0;
      rfcn.opt.num_threads = 0;
      local_388[0] = 0.0;
      local_388[1] = 0.0;
      local_398._0_4_ = 0x1010000;
      rfcn._vptr_Net = (_func_int **)ppAVar1;
      cv::imshow((string *)&rfcn,(_InputArray *)local_398);
      if ((Allocator **)rfcn._vptr_Net != ppAVar1) {
        operator_delete(rfcn._vptr_Net);
      }
      cv::waitKey(0);
      cv::Mat::~Mat(&image);
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar12 = 0;
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar6);
      iVar12 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    main_cold_1();
    iVar12 = -1;
  }
  return iVar12;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<Object> objects;
    detect_rfcn(m, objects);

    draw_objects(m, objects);

    return 0;
}